

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP3Deserializer::ParseMinifooter(BP3Deserializer *this,BufferSTL *bufferSTL)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  pointer pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  long lVar9;
  bool bVar10;
  long *plVar11;
  size_type *psVar12;
  long *plVar13;
  uint uVar14;
  uint uVar15;
  uint __len;
  string err;
  string __str;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar6 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar2 = pcVar6[-4];
  pcVar7 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < bVar2) {
    uVar15 = 1;
    if (9 < bVar2) {
      uVar15 = 3 - (bVar2 < 100);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar15);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_d0._M_dataplus._M_p,uVar15,(uint)bVar2);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x75ac30);
    paVar1 = &local_f0.field_2;
    psVar12 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0.field_2._8_8_ = plVar11[3];
      local_f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar12 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = plVar11[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_b0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Toolkit","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"format::bp::BP3Deserializer","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ParseMinifooter","");
    helper::Throw<std::runtime_error>(&local_f0,&local_d0,&local_90,&local_b0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  (this->m_Minifooter).IsLittleEndian = bVar2 == 0;
  bVar10 = helper::IsLittleEndian();
  if ((this->m_Minifooter).IsLittleEndian != bVar10) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Toolkit","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"format::bp::BP3Deserializer","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ParseMinifooter","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "reader found BigEndian bp file, this version of ADIOS2 wasn\'t compiled with the cmake flag -DADIOS2_USE_Endian_Reverse=ON explicitly, in call to Open"
               ,"");
    helper::Throw<std::runtime_error>(&local_b0,&local_f0,&local_d0,&local_90,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  pcVar8 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar10 = true;
  if (pcVar6[(long)(pcVar8 + (-2 - (long)pcVar7))] != 3) {
    if ((pcVar6[(long)(pcVar8 + (-2 - (long)pcVar7))] & 0xfdU) != 0) goto LAB_004f96ce;
    bVar10 = false;
  }
  (this->m_Minifooter).HasSubFiles = bVar10;
LAB_004f96ce:
  cVar3 = pcVar6[(long)(pcVar8 + (-1 - (long)pcVar7))];
  (this->m_Minifooter).Version = cVar3;
  if (cVar3 < '\x03') {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Toolkit","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"format::bp::BP3Deserializer","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ParseMinifooter","");
    cVar3 = (this->m_Minifooter).Version;
    uVar14 = (uint)cVar3;
    uVar15 = -uVar14;
    if (0 < (int)uVar14) {
      uVar15 = uVar14;
    }
    __len = 1;
    if (9 < uVar15) {
      __len = 3 - (uVar15 < 100);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (cVar3 >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (uVar14 >> 0x1f),__len,uVar15);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x75acc6);
    plVar13 = plVar11 + 2;
    if ((long *)*plVar11 == plVar13) {
      local_40 = *plVar13;
      lStack_38 = plVar11[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar13;
      local_50 = (long *)*plVar11;
    }
    local_48 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar12 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90.field_2._8_8_ = plVar11[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar12;
      local_90._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_90._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_b0,&local_f0,&local_d0,&local_90,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  lVar9 = -(ulong)*(uint *)(&this->field_0x198 + *(long *)(*(long *)this + -0x18)) - (long)pcVar7;
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_Minifooter,0,(char *)(this->m_Minifooter).VersionTag._M_string_length,
             (ulong)(pcVar6 + (long)((bufferSTL->m_Buffer).
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar9)));
  pcVar7 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar3 = pcVar6[(long)(pcVar7 + lVar9 + 0x18)];
  (this->m_Minifooter).ADIOSVersionMajor = cVar3 - 0x30U;
  cVar4 = pcVar6[(long)(pcVar7 + lVar9 + 0x19)];
  (this->m_Minifooter).ADIOSVersionMinor = cVar4 - 0x30U;
  cVar5 = pcVar6[(long)(pcVar7 + lVar9 + 0x1a)];
  (this->m_Minifooter).ADIOSVersionPatch = cVar5 - 0x30U;
  (this->m_Minifooter).ADIOSVersion =
       (uint)(byte)(cVar5 - 0x30U) +
       (uint)(byte)(cVar4 - 0x30U) * 1000 + (uint)(byte)(cVar3 - 0x30U) * 1000000;
  (this->m_Minifooter).PGIndexStart = *(uint64_t *)(pcVar6 + (long)(pcVar7 + lVar9 + 0x1c));
  (this->m_Minifooter).VarsIndexStart = *(uint64_t *)(pcVar6 + (long)(pcVar7 + lVar9 + 0x24));
  (this->m_Minifooter).AttributesIndexStart = *(uint64_t *)(pcVar6 + (long)(pcVar7 + lVar9 + 0x2c));
  return;
}

Assistant:

void BP3Deserializer::ParseMinifooter(const BufferSTL &bufferSTL)
{
    const auto &buffer = bufferSTL.m_Buffer;
    const size_t bufferSize = buffer.size();
    size_t position = bufferSize - 4;
    const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
    if (endianness > 1)
    {
        std::string err = "The endianness flag in the .bp file was neither zero nor one (" +
                          std::to_string(endianness) +
                          "), this indicates the the file is either corrupted, or not a .bp "
                          "file.";
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter", err);
    }
    m_Minifooter.IsLittleEndian = (endianness == 0) ? true : false;
#ifndef ADIOS2_HAVE_ENDIAN_REVERSE
    if (helper::IsLittleEndian() != m_Minifooter.IsLittleEndian)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter",
                                          "reader found BigEndian bp file, "
                                          "this version of ADIOS2 wasn't compiled "
                                          "with the cmake flag -DADIOS2_USE_Endian_Reverse=ON "
                                          "explicitly, in call to Open");
    }
#endif

    position += 1;

    const int8_t fileType =
        helper::ReadValue<int8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    if (fileType == 3)
    {
        m_Minifooter.HasSubFiles = true;
    }
    else if (fileType == 0 || fileType == 2)
    {
        m_Minifooter.HasSubFiles = false;
    }

    m_Minifooter.Version =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    if (m_Minifooter.Version < 3)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter",
                                          "ADIOS2 only supports bp format "
                                          "version 3 and above, found " +
                                              std::to_string(m_Minifooter.Version) + " version");
    }

    position = bufferSize - m_MetadataSet.MiniFooterSize;

    // Writer's ADIOS version
    m_Minifooter.VersionTag.assign(&buffer[position], 28);
    position += 24;
    m_Minifooter.ADIOSVersionMajor =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersionMinor =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersionPatch =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersion = m_Minifooter.ADIOSVersionMajor * 1000000 +
                                m_Minifooter.ADIOSVersionMinor * 1000 +
                                m_Minifooter.ADIOSVersionPatch;
    ++position;
    ;

    m_Minifooter.PGIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_Minifooter.VarsIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_Minifooter.AttributesIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
}